

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::LocalClient::whenMoreResolved(LocalClient *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar1;
  PromiseBase local_40;
  undefined1 local_38 [32];
  
  if (*(long **)(in_RSI + 0x60) == (long *)0x0) {
    if (*(char *)(in_RSI + 0x40) == '\x01') {
      kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_38);
      kj::Promise<void>::then<capnp::LocalClient::whenMoreResolved()::_lambda()_1_>
                ((Promise<void> *)&local_40,(anon_class_8_1_8991fb9c_for_func *)local_38);
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      (this->super_ClientHook).brand = (void *)local_40.node.ptr;
      local_40.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40.node);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_38);
      in_RDX = extraout_RDX_00;
    }
    else {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
    }
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x60) + 0x20))
              ((FixVoid<kj::Own<capnp::ClientHook>_> *)(local_38 + 8));
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Promise
              ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_40,
               (FixVoid<kj::Own<capnp::ClientHook>_> *)(local_38 + 8));
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = (void *)local_40.node.ptr;
    local_40.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40.node);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_38 + 8));
    in_RDX = extraout_RDX;
  }
  MVar1.ptr.field_1 = in_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->addRef());
    } else KJ_IF_SOME(t, resolveTask) {
      return t.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(resolved)->addRef();
      });
    } else {
      return kj::none;
    }